

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall kj::_::FiberBase::cancel(FiberBase *this)

{
  anon_enum_32 aVar1;
  Fault f;
  DebugComparison<kj::_::FiberBase::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1348:3)_&,_kj::_::FiberBase::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1348:3)>
  _kjCondition;
  Fault local_40;
  DebugComparison<kj::_::FiberBase::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1348:3)_&,_kj::_::FiberBase::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1348:3)>
  local_38;
  
  aVar1 = this->state;
  if (aVar1 == WAITING) {
    this->state = CANCELED;
    FiberStack::switchToFiber((this->stack).ptr);
    local_38.result = this->state == FINISHED;
    local_38.right = FINISHED;
    local_38.op.content.ptr = " == ";
    local_38.op.content.size_ = 5;
    local_38.left = &this->state;
    if (!local_38.result) {
      Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<kj::_::FiberBase::_unnamed_type_1_&,_unnamed_type_1_>&>
                (&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                 ,0x65c,FAILED,"state == FINISHED","_kjCondition,",&local_38);
      Debug::Fault::fatal(&local_40);
    }
  }
  else if (aVar1 != FINISHED) {
    if (1 < aVar1 - RUNNING) {
      return;
    }
    Debug::Fault::Fault<kj::Exception::Type,char_const(&)[29]>
              ((Fault *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0x666,FAILED,(char *)0x0,"\"fiber tried to cancel itself\"",
               (char (*) [29])"fiber tried to cancel itself");
    Debug::Fault::fatal((Fault *)&local_38);
  }
  FiberStack::reset((this->stack).ptr);
  return;
}

Assistant:

void FiberBase::cancel() {
  // Called by `~Fiber()` to begin teardown. We can't do this work in `~FiberBase()` because the
  // `Fiber` subclass contains members that may still be in-use until the fiber stops.

  switch (state) {
    case WAITING:
      // We can't just free the stack while the fiber is running. We need to force it to execute
      // until finished, so we cause it to throw an exception.
      state = CANCELED;
      stack->switchToFiber();

      // The fiber should only switch back to the main stack on completion, because any further
      // calls to wait() would throw before trying to switch.
      KJ_ASSERT(state == FINISHED);

      // The fiber shut down properly so the stack is safe to reuse.
      stack->reset();
      break;

    case RUNNING:
    case CANCELED:
      // Bad news.
      []() noexcept {
        KJ_FAIL_ASSERT("fiber tried to cancel itself");
      }();
      break;

    case FINISHED:
      // Normal completion, yay.
      stack->reset();
      break;
  }
}